

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Revision.cpp
# Opt level: O2

string * __thiscall
OpenMD::Revision::getHalfRevision_abi_cxx11_(string *__return_storage_ptr__,Revision *this)

{
  Revision *this_00;
  char *this_01;
  string local_50;
  string local_30;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  getVersion_abi_cxx11_(&local_50,this);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  this_00 = (Revision *)0x21617c;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getRevision_abi_cxx11_(&local_30,this_00);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_30);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  this_01 = "   ";
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getBuildDate_abi_cxx11_(&local_50,(Revision *)this_01);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string Revision::getHalfRevision() {
    std::string fr;
    fr.assign(getVersion());
    fr.append("  ");
    fr.append(getRevision().substr(0, 17));
    fr.append("   ");
    fr.append(getBuildDate());
    return fr;
  }